

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::detail::
int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned_long>::on_oct
          (int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned_long>
           *this)

{
  uint uVar1;
  basic_format_specs<char> *specs;
  buffer<char> *pbVar2;
  size_t sVar3;
  bool bVar4;
  ulong uVar5;
  char *__dest;
  byte *pbVar6;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  ptrdiff_t _Num;
  buffer<char> *c;
  ulong uVar10;
  long lVar11;
  string_view prefix;
  write_int_data<char> data;
  char *in_stack_ffffffffffffff98;
  write_int_data<char> local_40;
  
  lVar11 = 0;
  uVar5 = this->abs_value;
  do {
    lVar11 = lVar11 + 1;
    bVar4 = 7 < uVar5;
    uVar5 = uVar5 >> 3;
  } while (bVar4);
  specs = this->specs;
  if (((char)specs->field_0x9 < '\0') && (this->abs_value != 0 && specs->precision <= (int)lVar11))
  {
    uVar1 = this->prefix_size;
    this->prefix_size = uVar1 + 1;
    this->prefix[uVar1] = '0';
  }
  pbVar2 = (this->out).container;
  pcVar9 = this->prefix;
  uVar7 = (ulong)this->prefix_size;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = pcVar9;
  prefix.size_._4_4_ = 0;
  write_int_data<char>::write_int_data(&local_40,(int)lVar11,prefix,specs);
  uVar5 = (ulong)specs->width;
  if (-1 < (long)uVar5) {
    uVar10 = 0;
    if (local_40.size <= uVar5) {
      uVar10 = uVar5 - local_40.size;
    }
    uVar5 = uVar10 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                                (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
    sVar3 = pbVar2->size_;
    uVar8 = local_40.size + sVar3 + (specs->fill).size_ * uVar10;
    if (pbVar2->capacity_ < uVar8) {
      (**pbVar2->_vptr_buffer)(pbVar2,uVar8);
    }
    pbVar2->size_ = uVar8;
    __dest = fill<char*,char>(pbVar2->ptr_ + sVar3,uVar5,&specs->fill);
    if (uVar7 != 0) {
      memmove(__dest,pcVar9,uVar7);
      __dest = __dest + uVar7;
    }
    pcVar9 = __dest;
    if (local_40.padding != 0) {
      pcVar9 = __dest + local_40.padding;
      memset(__dest,0x30,local_40.padding);
    }
    pbVar6 = (byte *)(pcVar9 + lVar11);
    uVar7 = this->abs_value;
    do {
      pbVar6 = pbVar6 + -1;
      *pbVar6 = (byte)uVar7 & 7 | 0x30;
      bVar4 = 7 < uVar7;
      uVar7 = uVar7 >> 3;
    } while (bVar4);
    fill<char*,char>(pcVar9 + lVar11,uVar10 - uVar5,&specs->fill);
    (this->out).container = pbVar2;
    return;
  }
  assert_fail(pcVar9,0,in_stack_ffffffffffffff98);
}

Assistant:

void on_oct() {
    int num_digits = count_digits<3>(abs_value);
    if (specs.alt && specs.precision <= num_digits && abs_value != 0) {
      // Octal prefix '0' is counted as a digit, so only add it if precision
      // is not greater than the number of digits.
      prefix[prefix_size++] = '0';
    }
    out = write_int(out, num_digits, get_prefix(), specs,
                    [this, num_digits](iterator it) {
                      return format_uint<3, Char>(it, abs_value, num_digits);
                    });
  }